

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_random(Curl_easy *data,uchar *entropy,size_t length)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  
  if (data == (Curl_easy *)0x0) {
    _Var1 = rand_enough();
    if (_Var1) goto LAB_0013f215;
  }
  else {
    CVar2 = Curl_ossl_seed(data);
    if (CVar2 == CURLE_OK) {
LAB_0013f215:
      iVar3 = curlx_uztosi(length);
      iVar3 = RAND_bytes(entropy,iVar3);
      return (uint)(iVar3 != 1) * 2;
    }
  }
  return CURLE_FAILED_INIT;
}

Assistant:

CURLcode Curl_ossl_random(struct Curl_easy *data, unsigned char *entropy,
                          size_t length)
{
  int rc;
  if(data) {
    if(Curl_ossl_seed(data)) /* Initiate the seed if not already done */
      return CURLE_FAILED_INIT; /* couldn't seed for some reason */
  }
  else {
    if(!rand_enough())
      return CURLE_FAILED_INIT;
  }
  /* RAND_bytes() returns 1 on success, 0 otherwise.  */
  rc = RAND_bytes(entropy, curlx_uztosi(length));
  return (rc == 1 ? CURLE_OK : CURLE_FAILED_INIT);
}